

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O2

void progressbarinit(ProgressData *bar,Configurable *config)

{
  long lVar1;
  int iVar2;
  char *__nptr;
  long lVar3;
  size_t sVar4;
  char *endptr;
  
  bar->initial_size = 0;
  *(undefined8 *)&bar->width = 0;
  bar->out = (FILE *)0x0;
  *(undefined8 *)bar = 0;
  bar->prev = 0;
  if (config->use_resume == true) {
    bar->initial_size = config->resume_from;
  }
  __nptr = (char *)curl_getenv("COLUMNS");
  if (__nptr == (char *)0x0) {
    bar->width = 0x4f;
  }
  else {
    lVar3 = strtol(__nptr,&endptr,10);
    if (endptr == __nptr) {
      iVar2 = 0x4f;
    }
    else {
      sVar4 = strlen(__nptr);
      lVar1 = 0x4f;
      if (0 < lVar3) {
        lVar1 = lVar3;
      }
      iVar2 = (int)lVar1;
      if (endptr != __nptr + sVar4) {
        iVar2 = 0x4f;
      }
    }
    bar->width = iVar2;
    curl_free(__nptr);
  }
  bar->out = config->errors;
  return;
}

Assistant:

void progressbarinit(struct ProgressData *bar,
                     struct Configurable *config)
{
#ifdef __EMX__
  /* 20000318 mgs */
  int scr_size[2];
#endif
  char *colp;

  memset(bar, 0, sizeof(struct ProgressData));

  /* pass this through to progress function so
   * it can display progress towards total file
   * not just the part that's left. (21-may-03, dbyron) */
  if(config->use_resume)
    bar->initial_size = config->resume_from;

/* TODO: get terminal width through ansi escapes or something similar.
   try to update width when xterm is resized... - 19990617 larsa */
#ifndef __EMX__
  /* 20000318 mgs
   * OS/2 users most likely won't have this env var set, and besides that
   * we're using our own way to determine screen width */
  colp = curlx_getenv("COLUMNS");
  if(colp) {
    char *endptr;
    long num = strtol(colp, &endptr, 10);
    if((endptr != colp) && (endptr == colp + strlen(colp)) && (num > 0))
      bar->width = (int)num;
    else
      bar->width = 79;
    curl_free(colp);
  }
  else
    bar->width = 79;
#else
  /* 20000318 mgs
   * We use this emx library call to get the screen width, and subtract
   * one from what we got in order to avoid a problem with the cursor
   * advancing to the next line if we print a string that is as long as
   * the screen is wide. */

  _scrsize(scr_size);
  bar->width = scr_size[0] - 1;
#endif

  bar->out = config->errors;
}